

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::findScalarConstant(Builder *this,Op typeClass,Op opcode,Id typeId,uint value)

{
  int iVar1;
  Op OVar2;
  Id IVar3;
  uint uVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  reference ppIVar7;
  Id local_3c;
  Id local_38;
  int local_34;
  Instruction *pIStack_30;
  int i;
  Instruction *constant;
  uint value_local;
  Id typeId_local;
  Op opcode_local;
  Op typeClass_local;
  Builder *this_local;
  
  local_34 = 0;
  constant._0_4_ = value;
  constant._4_4_ = typeId;
  value_local = opcode;
  typeId_local = typeClass;
  _opcode_local = this;
  while( true ) {
    iVar1 = local_34;
    local_38 = typeId_local;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedConstants,&local_38);
    sVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar5);
    if ((int)sVar6 <= iVar1) {
      return 0;
    }
    local_3c = typeId_local;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedConstants,&local_3c);
    ppIVar7 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar5,(long)local_34);
    pIStack_30 = *ppIVar7;
    OVar2 = spv::Instruction::getOpCode(pIStack_30);
    if (((OVar2 == value_local) &&
        (IVar3 = spv::Instruction::getTypeId(pIStack_30), IVar3 == constant._4_4_)) &&
       (uVar4 = spv::Instruction::getImmediateOperand(pIStack_30,0), uVar4 == (uint)constant))
    break;
    local_34 = local_34 + 1;
  }
  IVar3 = spv::Instruction::getResultId(pIStack_30);
  return IVar3;
}

Assistant:

Id Builder::findScalarConstant(Op typeClass, Op opcode, Id typeId, unsigned value)
{
    Instruction* constant;
    for (int i = 0; i < (int)groupedConstants[typeClass].size(); ++i) {
        constant = groupedConstants[typeClass][i];
        if (constant->getOpCode() == opcode &&
            constant->getTypeId() == typeId &&
            constant->getImmediateOperand(0) == value)
            return constant->getResultId();
    }

    return 0;
}